

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRenderPassTests.cpp
# Opt level: O0

string * __thiscall
vkt::(anonymous_namespace)::clearValueToString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,VkFormat vkFormat,
          VkClearValue value)

{
  bool bVar1;
  TextureFormat TVar2;
  ostream *poVar3;
  uint in_register_00000014;
  undefined8 uVar4;
  VkClearColorValue value_00;
  ostringstream local_1a8 [8];
  ostringstream stream;
  ChannelOrder local_2c;
  TextureFormat format;
  VkFormat vkFormat_local;
  VkClearValue value_local;
  
  uVar4 = value._8_8_;
  value_00._0_8_ = value.depthStencil;
  TVar2 = ::vk::mapVkFormat((VkFormat)this);
  local_2c = TVar2.order;
  bVar1 = tcu::hasStencilComponent(local_2c);
  if ((bVar1) || (bVar1 = tcu::hasDepthComponent(local_2c), bVar1)) {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::operator<<((ostream *)local_1a8,"(");
    bVar1 = tcu::hasStencilComponent(local_2c);
    if (bVar1) {
      poVar3 = std::operator<<((ostream *)local_1a8,"stencil: ");
      std::ostream::operator<<(poVar3,in_register_00000014);
    }
    bVar1 = tcu::hasStencilComponent(local_2c);
    if ((bVar1) && (bVar1 = tcu::hasDepthComponent(local_2c), bVar1)) {
      std::operator<<((ostream *)local_1a8,", ");
    }
    bVar1 = tcu::hasDepthComponent(local_2c);
    if (bVar1) {
      poVar3 = std::operator<<((ostream *)local_1a8,"depth: ");
      std::ostream::operator<<(poVar3,(float)vkFormat);
    }
    std::operator<<((ostream *)local_1a8,")");
    std::__cxx11::ostringstream::str();
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
  }
  else {
    value_00._8_8_ = uVar4;
    clearColorToString_abi_cxx11_
              (__return_storage_ptr__,(_anonymous_namespace_ *)((ulong)this & 0xffffffff),vkFormat,
               value_00);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string clearValueToString (VkFormat vkFormat, VkClearValue value)
{
	const tcu::TextureFormat	format	= mapVkFormat(vkFormat);

	if (tcu::hasStencilComponent(format.order) || tcu::hasDepthComponent(format.order))
	{
		std::ostringstream stream;

		stream << "(";

		if (tcu::hasStencilComponent(format.order))
			stream << "stencil: " << value.depthStencil.stencil;

		if (tcu::hasStencilComponent(format.order) && tcu::hasDepthComponent(format.order))
			stream << ", ";

		if (tcu::hasDepthComponent(format.order))
			stream << "depth: " << value.depthStencil.depth;

		stream << ")";

		return stream.str();
	}
	else
		return clearColorToString(vkFormat, value.color);
}